

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

int __thiscall
soplex::SPxFastRT<double>::maxSelect
          (SPxFastRT<double> *this,double *val,double *stab,double *best,double *bestDelta,
          double max,UpdateVector<double> *update,VectorBase<double> *lowBound,
          VectorBase<double> *upBound,int start,int incr)

{
  Type TVar1;
  int iVar2;
  uint uVar3;
  pointer pdVar4;
  pointer pdVar5;
  int *piVar6;
  pointer pdVar7;
  SPxSolverBase<double> *pSVar8;
  SPxId *pSVar9;
  int iVar10;
  ulong uVar11;
  pointer pdVar12;
  uint *puVar13;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar14;
  bool bVar15;
  double dVar16;
  uint local_b0;
  uint local_a8;
  DataKey local_50;
  double local_48;
  undefined8 uStack_40;
  
  TVar1 = (this->super_SPxRatioTester<double>).m_type;
  if (TVar1 == LEAVE) {
    bVar15 = false;
  }
  else {
    bVar15 = ((this->super_SPxRatioTester<double>).thesolver)->theRep == ROW;
  }
  pdVar4 = (upBound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar12 = (lowBound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar5 = (update->super_VectorBase<double>).val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar6 = (update->thedelta).super_IdxSet.idx;
  pdVar7 = (update->thedelta).super_VectorBase<double>.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  iVar2 = (update->thedelta).super_IdxSet.num;
  puVar13 = (uint *)(piVar6 + start);
  local_b0 = 0xffffffff;
  local_a8 = local_b0;
  do {
    if (piVar6 + iVar2 <= puVar13) {
      if (0 < (int)local_b0 && (int)local_a8 < 0) {
        uVar11 = (ulong)local_b0;
        if (0.0 < pdVar7[uVar11]) {
          pdVar12 = pdVar5;
          pdVar5 = pdVar4;
        }
        *bestDelta = pdVar5[uVar11] - pdVar12[uVar11];
      }
      return local_a8;
    }
    uVar3 = *puVar13;
    local_48 = pdVar7[(int)uVar3];
    if (TVar1 == LEAVE) {
      pSVar8 = (this->super_SPxRatioTester<double>).thesolver;
      if (this->iscoid == true) {
        pDVar14 = (pSVar8->super_SPxBasisBase<double>).thedesc.costat;
      }
      else {
        pDVar14 = (pSVar8->super_SPxBasisBase<double>).thedesc.stat;
      }
      if (pSVar8->theRep * pDVar14->data[(int)uVar3] < 1) goto LAB_002069e8;
    }
    else {
LAB_002069e8:
      if (bVar15) {
        pSVar8 = (this->super_SPxRatioTester<double>).thesolver;
        pSVar9 = (pSVar8->super_SPxBasisBase<double>).theBaseId.data;
        if (0 < pSVar9[(int)uVar3].super_DataKey.info) {
          uStack_40 = 0;
          SPxColId::SPxColId((SPxColId *)&local_50,pSVar9 + (int)uVar3);
          iVar10 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                             (&(pSVar8->super_SPxLPBase<double>).super_LPColSetBase<double>.
                               super_SVSetBase<double>.set,&local_50);
          if ((pSVar8->super_SPxBasisBase<double>).thedesc.colstat.data[iVar10] == P_FIXED)
          goto LAB_00206aee;
        }
      }
      if (local_48 <= *stab) {
        if (local_48 < -*stab) {
          dVar16 = (pdVar12[(int)uVar3] - pdVar5[(int)uVar3]) / local_48;
          if (max < dVar16) goto LAB_00206ac3;
          *val = dVar16;
          *stab = -local_48;
          local_a8 = uVar3;
        }
      }
      else {
        dVar16 = (pdVar4[(int)uVar3] - pdVar5[(int)uVar3]) / local_48;
        if (max < dVar16) {
LAB_00206ac3:
          if (*best <= dVar16 && dVar16 != *best) {
            *best = dVar16;
            local_b0 = uVar3;
          }
        }
        else {
          *val = dVar16;
          *stab = local_48;
          local_a8 = uVar3;
        }
      }
    }
LAB_00206aee:
    puVar13 = puVar13 + incr;
  } while( true );
}

Assistant:

int SPxFastRT<R>::maxSelect(
   R& val,
   R& stab,
   R& best,
   R& bestDelta,
   R max,
   const UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i;
   R x, y;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();
   const int* last = idx + update.delta().size();

   int nr = -1;
   int bestNr = -1;

   for(idx += start; idx < last; idx += incr)
   {
      i = *idx;
      x = upd[i];

      // in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables
      if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                     && this->thesolver->isBasic(i))))
         continue;

      if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
            && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
            == SPxBasisBase<R>::Desc::P_FIXED)
         continue;

      if(x > stab)
      {
         y = (up[i] - vec[i]) / x;

         if(y <= max)
         {
            val = y;
            nr = i;
            stab = x;
         }
         else if(y > best)
         {
            best = y;
            bestNr = i;
         }
      }
      else if(x < -stab)
      {
         y = (low[i] - vec[i]) / x;

         if(y <= max)
         {
            val = y;
            nr = i;
            stab = -x;
         }
         else if(y > best)
         {
            best = y;
            bestNr = i;
         }
      }
   }

   if(nr < 0 && bestNr > 0)
   {
      if(upd[bestNr] > 0)
         bestDelta = up[bestNr] - vec[bestNr];
      else
         bestDelta = vec[bestNr] - low[bestNr];
   }

   return nr;
}